

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O0

void growl(monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_18;
  char *growl_verb;
  monst *mtmp_local;
  
  if ((((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) &&
      ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) && (mtmp->data->msound != '\0')) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      local_18 = growl_sound(mtmp);
    }
    else {
      iVar2 = rn2(0x24);
      local_18 = h_sounds[iVar2];
    }
    if (local_18 != (char *)0x0) {
      pcVar3 = Monnam(mtmp);
      pcVar4 = vtense((char *)0x0,local_18);
      pline("%s %s!",pcVar3,pcVar4);
      if (flags.run != 0) {
        nomul(0,(char *)0x0);
      }
      wake_nearto((int)mtmp->mx,(int)mtmp->my,mtmp->data->mlevel * 0x12);
    }
  }
  return;
}

Assistant:

void growl(struct monst *mtmp)
{
    const char *growl_verb = 0;

    if (mtmp->msleeping || !mtmp->mcanmove || !mtmp->data->msound)
	return;

    /* presumably nearness and soundok checks have already been made */
    if (Hallucination)
	growl_verb = h_sounds[rn2(SIZE(h_sounds))];
    else
	growl_verb = growl_sound(mtmp);
    if (growl_verb) {
	pline("%s %s!", Monnam(mtmp), vtense(NULL, growl_verb));
	if (flags.run) nomul(0, NULL);
	wake_nearto(mtmp->mx, mtmp->my, mtmp->data->mlevel * 18);
    }
}